

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

undefined8 lest::compiler_abi_cxx11_(void)

{
  ostream *poVar1;
  undefined8 in_RDI;
  ostringstream local_188 [8];
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"clang ");
  std::operator<<(poVar1,
                  "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline text compiler()
{
    std::ostringstream os;
#if   defined (__clang__ )
    os << "clang " << __clang_version__;
#elif defined (__GNUC__  )
    os << "gcc " << __GNUC__ << "." << __GNUC_MINOR__ << "." << __GNUC_PATCHLEVEL__;
#elif defined ( _MSC_VER )
    os << "MSVC " << (_MSC_VER / 100 - 5 - (_MSC_VER < 1900)) << " (" << _MSC_VER << ")";
#else
    os << "[compiler]";
#endif
    return os.str();
}